

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_xform.cpp
# Opt level: O2

bool __thiscall
ON_Xform::GetKMLOrientationAnglesDegrees
          (ON_Xform *this,double *heading_degrees,double *tilt_degrees,double *roll_degrees)

{
  bool bVar1;
  double dVar2;
  double roll_radians;
  double tilt_radians;
  double heading_radians;
  double local_48;
  double local_40;
  double local_38;
  
  local_38 = ON_DBL_QNAN;
  local_40 = ON_DBL_QNAN;
  local_48 = ON_DBL_QNAN;
  bVar1 = GetKMLOrientationAnglesRadians(this,&local_38,&local_40,&local_48);
  dVar2 = Internal_RadiansToPrettyKMLDegrees(local_38,0.0);
  *heading_degrees = dVar2;
  dVar2 = Internal_RadiansToPrettyKMLDegrees(local_40,-180.0);
  *tilt_degrees = dVar2;
  dVar2 = Internal_RadiansToPrettyKMLDegrees(local_48,-180.0);
  *roll_degrees = dVar2;
  return bVar1;
}

Assistant:

bool ON_Xform::GetKMLOrientationAnglesDegrees(double& heading_degrees, double& tilt_degrees, double& roll_degrees) const
{
  double heading_radians = ON_DBL_QNAN;
  double tilt_radians = ON_DBL_QNAN;
  double roll_radians = ON_DBL_QNAN;
  const bool rc = ON_Xform::GetKMLOrientationAnglesRadians(heading_radians, tilt_radians, roll_radians);
  heading_degrees = Internal_RadiansToPrettyKMLDegrees(heading_radians, 0.0);
  tilt_degrees = Internal_RadiansToPrettyKMLDegrees(tilt_radians, -180.0);
  roll_degrees = Internal_RadiansToPrettyKMLDegrees(roll_radians, -180.0);
  return rc;
}